

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa_verification.c
# Opt level: O2

aspa_hop_result aspa_check_hop(aspa_table *aspa_table,uint32_t customer_asn,uint32_t provider_asn)

{
  long lVar1;
  aspa_store_node *paVar2;
  uint32_t *base;
  aspa_record *paVar3;
  uint32_t *puVar4;
  size_t top;
  size_t sVar5;
  size_t sVar6;
  aspa_hop_result aVar7;
  byte bVar8;
  aspa_store_node **ppaVar9;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar8 = 0;
  aVar7 = ASPA_PROVIDER_PLUS;
  ppaVar9 = &aspa_table->store;
  while (paVar2 = *ppaVar9, paVar2 != (aspa_store_node *)0x0) {
    paVar3 = aspa_array_search(paVar2->aspa_array,customer_asn);
    if (paVar3 != (aspa_record *)0x0) {
      sVar5 = paVar3->provider_count;
      puVar4 = paVar3->provider_asns;
      sVar6 = sVar5;
      while (sVar6 != 0) {
        sVar6 = sVar5 >> 1;
        if (provider_asn == puVar4[sVar6]) goto LAB_00107417;
        if (-1 < (int)(provider_asn - puVar4[sVar6])) {
          puVar4 = puVar4 + sVar6;
        }
        sVar5 = sVar5 - sVar6;
      }
      bVar8 = 1;
    }
    ppaVar9 = &paVar2->next;
  }
  aVar7 = (aspa_hop_result)bVar8;
LAB_00107417:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return aVar7;
  }
  __stack_chk_fail();
}

Assistant:

enum aspa_hop_result aspa_check_hop(struct aspa_table *aspa_table, uint32_t customer_asn, uint32_t provider_asn)
{
	bool customer_found = false;

	for (struct aspa_store_node *node = aspa_table->store; node != NULL; node = node->next) {
		struct aspa_record *aspa_record = aspa_array_search(node->aspa_array, customer_asn);

		if (!aspa_record)
			continue;

		customer_found = true;

		// Provider ASNs are sorted in ascending order.
		// We consider this an implementation detail, callers must not make any assumptions on the
		// ordering of provider ASNs.
		uint32_t *provider =
			binary_search_asns(provider_asn, aspa_record->provider_asns, aspa_record->provider_count);

		if (provider)
			return ASPA_PROVIDER_PLUS;
	}

	return customer_found ? ASPA_NOT_PROVIDER_PLUS : ASPA_NO_ATTESTATION;
}